

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>::
insert<google::protobuf::Map<std::__cxx11::string,google::protobuf::Value>::const_iterator>
          (Map<std::__cxx11::string,google::protobuf::Value> *this,const_iterator first,
          const_iterator last)

{
  Value *from;
  value_type *key;
  Value *this_00;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>,_unsigned_long>
  local_70;
  TrivialKey local_50;
  undefined1 auStack_48 [8];
  const_iterator it;
  
  auStack_48 = (undefined1  [8])first.it_.node_;
  it.it_.node_ = (Node *)first.it_.m_;
  it.it_.m_ = (InnerMap *)first.it_.bucket_index_;
  if (first.it_.node_ != last.it_.node_) {
    do {
      local_50.key_ = &((KeyValuePair *)auStack_48)->v_->first;
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::InnerMap::FindHelper(&local_70,*(InnerMap **)(this + 0x10),&local_50,(TreeIterator *)0x0);
      if (local_70.first.node_ == (Node *)0x0) {
        key = ((KeyValuePair *)auStack_48)->v_;
        from = &key->second;
        this_00 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                  ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                                *)this,&key->first);
        if (from != this_00) {
          Value::Clear(this_00);
          Value::MergeFrom(this_00,from);
        }
      }
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::InnerMap::
      iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
      ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
                    *)auStack_48);
    } while (auStack_48 != (undefined1  [8])last.it_.node_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }